

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

void utrie_close_63(UNewTrie *trie)

{
  UNewTrie *trie_local;
  
  if (trie != (UNewTrie *)0x0) {
    if (trie->isDataAllocated != '\0') {
      uprv_free_63(trie->data);
      trie->data = (uint32_t *)0x0;
    }
    if (trie->isAllocated != '\0') {
      uprv_free_63(trie);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie_close(UNewTrie *trie) {
    if(trie!=NULL) {
        if(trie->isDataAllocated) {
            uprv_free(trie->data);
            trie->data=NULL;
        }
        if(trie->isAllocated) {
            uprv_free(trie);
        }
    }
}